

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_102615::StatTestMiddle::Run(StatTestMiddle *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Test *pTVar3;
  bool bVar4;
  int iVar5;
  mapped_type *pmVar6;
  Node *pNVar7;
  string err;
  key_type local_70;
  string local_50;
  
  iVar5 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_StatTest).super_StateTestWithBuiltinRules.state_,
              "build out: cat mid\nbuild mid: cat in\n",(ManifestParserOptions)0x0);
  if (iVar5 != g_current_test->assertion_failures_) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    return;
  }
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"in","");
  this_00 = &(this->super_StatTest).mtimes_;
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[](this_00,&local_70);
  *pmVar6 = 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"mid","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[](this_00,&local_70);
  *pmVar6 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"out","");
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[](this_00,&local_70);
  *pmVar6 = 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"out","");
  pNVar7 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  pTVar3 = g_current_test;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)paVar1;
  bVar4 = Node::Stat(pNVar7,&(this->super_StatTest).super_DiskInterface,&local_70);
  testing::Test::Check
            (pTVar3,bVar4,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
             ,0x149,"out->Stat(this, &err)");
  pTVar3 = g_current_test;
  iVar5 = std::__cxx11::string::compare((char *)&local_70);
  testing::Test::Check
            (pTVar3,iVar5 == 0,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
             ,0x14a,"\"\" == err");
  bVar4 = testing::Test::Check
                    (g_current_test,
                     (long)(this->super_StatTest).stats_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->super_StatTest).stats_.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start == 0x20,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                     ,0x14b,"1u == stats_.size()");
  if (bVar4) {
    DependencyScan::RecomputeDirty
              (&(this->super_StatTest).scan_,pNVar7,(vector<Node_*,_std::allocator<Node_*>_> *)0x0,
               (string *)0x0);
    pTVar3 = g_current_test;
    paVar2 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"in","");
    pNVar7 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_50);
    bVar4 = testing::Test::Check
                      (pTVar3,(bool)(pNVar7->dirty_ ^ 1),
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                       ,0x14d,"GetNode(\"in\")->dirty()");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    pTVar3 = g_current_test;
    if (bVar4) {
      local_50._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"mid","");
      pNVar7 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_50);
      bVar4 = testing::Test::Check
                        (pTVar3,pNVar7->dirty_,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                         ,0x14e,"GetNode(\"mid\")->dirty()");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pTVar3 = g_current_test;
      if (bVar4) {
        local_50._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"out","");
        pNVar7 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_50);
        bVar4 = testing::Test::Check
                          (pTVar3,pNVar7->dirty_,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/disk_interface_test.cc"
                           ,0x14f,"GetNode(\"out\")->dirty()");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (bVar4) goto LAB_00167763;
      }
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_00167763:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(StatTest, Middle) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build out: cat mid\n"
"build mid: cat in\n"));

  mtimes_["in"] = 1;
  mtimes_["mid"] = 0;  // missing
  mtimes_["out"] = 1;

  Node* out = GetNode("out");
  string err;
  EXPECT_TRUE(out->Stat(this, &err));
  EXPECT_EQ("", err);
  ASSERT_EQ(1u, stats_.size());
  scan_.RecomputeDirty(out, NULL, NULL);
  ASSERT_FALSE(GetNode("in")->dirty());
  ASSERT_TRUE(GetNode("mid")->dirty());
  ASSERT_TRUE(GetNode("out")->dirty());
}